

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PpTokens.cpp
# Opt level: O2

bool __thiscall glslang::TPpContext::TokenStream::peekUntokenizedPasting(TokenStream *this)

{
  size_t sVar1;
  bool bVar2;
  
  sVar1 = this->currentPos;
  while( true ) {
    bVar2 = peekToken(this,0x20);
    if (!bVar2) break;
    this->currentPos = this->currentPos + 1;
  }
  bVar2 = peekToken(this,0x23);
  if (bVar2) {
    this->currentPos = this->currentPos + 1;
    bVar2 = peekToken(this,0x23);
  }
  else {
    bVar2 = false;
  }
  this->currentPos = sVar1;
  return bVar2;
}

Assistant:

bool TPpContext::TokenStream::peekUntokenizedPasting()
{
    // don't return early, have to restore this
    size_t savePos = currentPos;

    // skip white-space
    while (peekToken(' '))
        ++currentPos;

    // check for ##
    bool pasting = false;
    if (peekToken('#')) {
        ++currentPos;
        if (peekToken('#'))
            pasting = true;
    }

    currentPos = savePos;

    return pasting;
}